

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void d68000_exg_aa(m68k_info *info)

{
  cs_m68k *pcVar1;
  
  pcVar1 = build_init_op(info,0x52,2,4);
  pcVar1->operands[0].address_mode = M68K_AM_NONE;
  pcVar1->operands[0].field_0.reg = (info->ir >> 9 & 7) + M68K_REG_A0;
  pcVar1->operands[1].address_mode = M68K_AM_NONE;
  pcVar1->operands[1].field_0.reg = (info->ir & 7) + M68K_REG_A0;
  return;
}

Assistant:

static void d68000_exg_aa(m68k_info *info)
{
	cs_m68k_op* op0;
	cs_m68k_op* op1;
	cs_m68k* ext = build_init_op(info, M68K_INS_EXG, 2, 4);

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];

	op0->address_mode = M68K_AM_NONE;
	op0->reg = M68K_REG_A0 + ((info->ir >> 9) & 7);

	op1->address_mode = M68K_AM_NONE;
	op1->reg = M68K_REG_A0 + (info->ir & 7);
}